

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O1

void __thiscall raspicam::_private::Private_Impl_Still::commitMetering(Private_Impl_Still *this)

{
  char *__s;
  MMAL_STATUS_T MVar1;
  size_t sVar2;
  MMAL_PARAMETER_EXPOSUREMETERINGMODE_T meter_mode;
  MMAL_PARAMETER_HEADER_T local_14;
  RASPICAM_METERING local_c;
  
  local_14.id = 0x10013;
  local_14.size = 0xc;
  local_c = RASPICAM_METERING_AVERAGE;
  if (this->metering - RASPICAM_METERING_SPOT < 3) {
    local_c = this->metering;
  }
  MVar1 = mmal_port_parameter_set(this->camera->control,&local_14);
  if (MVar1 != MMAL_SUCCESS) {
    __s = this->API_NAME;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,": Failed to set metering parameter.\n",0x24);
  }
  return;
}

Assistant:

void Private_Impl_Still::commitMetering() {
            MMAL_PARAMETER_EXPOSUREMETERINGMODE_T meter_mode = {{MMAL_PARAMETER_EXP_METERING_MODE, sizeof ( meter_mode ) }, convertMetering ( metering ) };
            if ( mmal_port_parameter_set ( camera->control, &meter_mode.hdr ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set metering parameter.\n";
        }